

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::compute_median
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                 *maps)

{
  pointer ppPVar1;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  vector<double,_std::allocator<double>_> to_compute_median;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_maps;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  check_and_initialize_maps(&local_48,this,maps);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,&local_61);
  if (local_48.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    do {
      if (local_48.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar4 = 0;
        do {
          ppPVar1 = (maps->
                    super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar3 = (long)(maps->
                        super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1;
          if (lVar3 != 0) {
            lVar5 = 0;
            do {
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] =
                   *(double *)
                    (*(long *)(*(long *)&(ppPVar1[lVar5]->heat_map).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar6 * 0x18) +
                    lVar4 * 8);
              lVar5 = lVar5 + 1;
            } while (lVar3 >> 3 != lVar5);
          }
          lVar3 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if ((lVar3 != 0) &&
             ((pointer)((lVar3 >> 1 & 0xfffffffffffffff8U) +
                       (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) !=
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish)) {
            lVar5 = 0x3f;
            if (lVar3 >> 3 != 0) {
              for (; (ulong)(lVar3 >> 3) >> lVar5 == 0; lVar5 = lVar5 + -1) {
              }
            }
            std::
            __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
          }
          local_48.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar4] =
               *(double *)
                ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start +
                ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U));
          lVar4 = lVar4 + 1;
        } while (lVar4 != (long)local_48.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_48.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != ((long)local_48.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,&local_48);
  pPVar2 = *(maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  this->min_ = pPVar2->min_;
  this->max_ = pPVar2->max_;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::compute_median(const std::vector<Persistence_heat_maps*>& maps) {
  std::vector<std::vector<double> > heat_maps = this->check_and_initialize_maps(maps);

  std::vector<double> to_compute_median(maps.size());
  for (size_t i = 0; i != heat_maps.size(); ++i) {
    for (size_t j = 0; j != heat_maps[i].size(); ++j) {
      for (size_t map_no = 0; map_no != maps.size(); ++map_no) {
        to_compute_median[map_no] = maps[map_no]->heat_map[i][j];
      }
      std::nth_element(to_compute_median.begin(), to_compute_median.begin() + to_compute_median.size() / 2,
                       to_compute_median.end());
      heat_maps[i][j] = to_compute_median[to_compute_median.size() / 2];
    }
  }
  this->heat_map = heat_maps;
  this->min_ = maps[0]->min_;
  this->max_ = maps[0]->max_;
}